

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any cs_impl::any::make<std::__cxx11::string>(void)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  proxy *in_RDI;
  
  if ((DAT_0033f1c0 == 0) || (cs::global_thread_counter != 0)) {
    puVar1 = (undefined8 *)operator_new(0x28);
  }
  else {
    puVar1 = *(undefined8 **)(&holder<int>::allocator + DAT_0033f1c0 * 8);
    DAT_0033f1c0 = DAT_0033f1c0 + -1;
  }
  puVar1[3] = 0;
  puVar1[4] = 0;
  *puVar1 = &PTR__holder_0032dc40;
  puVar1[1] = puVar1 + 3;
  puVar1[2] = 0;
  if ((DAT_00344820 == 0) || (cs::global_thread_counter != 0)) {
    puVar2 = (undefined1 *)operator_new(0x18);
  }
  else {
    puVar2 = (undefined1 *)(&cs::null_pointer)[DAT_00344820];
    DAT_00344820 = DAT_00344820 + -1;
  }
  *puVar2 = 0;
  *(undefined2 *)(puVar2 + 2) = 0;
  *(undefined8 *)(puVar2 + 8) = 1;
  *(undefined8 **)(puVar2 + 0x10) = puVar1;
  *(undefined1 **)in_RDI = puVar2;
  return (any)in_RDI;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}